

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# array.h
# Opt level: O2

Array<kj::CappedArray<char,_26UL>_> * __thiscall
kj::Array<kj::CappedArray<char,_26UL>_>::operator=
          (Array<kj::CappedArray<char,_26UL>_> *this,Array<kj::CappedArray<char,_26UL>_> *other)

{
  dispose(this);
  this->ptr = other->ptr;
  this->size_ = other->size_;
  this->disposer = other->disposer;
  other->ptr = (CappedArray<char,_26UL> *)0x0;
  other->size_ = 0;
  return this;
}

Assistant:

inline Array& operator=(Array&& other) {
    dispose();
    ptr = other.ptr;
    size_ = other.size_;
    disposer = other.disposer;
    other.ptr = nullptr;
    other.size_ = 0;
    return *this;
  }